

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O3

void __thiscall
UnicodeFullTest_string_cast_Test<std::pair<char,_char16_t>_>::TestBody
          (UnicodeFullTest_string_cast_Test<std::pair<char,_char16_t>_> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  *paVar1;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  _Alloc_hider _Var2;
  jessilib *this_00;
  char *pcVar3;
  char32_t (*in_RDX) [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_string;
  basic_string_view<char,_std::char_traits<char>_> *extraout_RDX_00;
  basic_string_view<char,_std::char_traits<char>_> *extraout_RDX_01;
  basic_string_view<char,_std::char_traits<char>_> *extraout_RDX_02;
  basic_string_view<char,_std::char_traits<char>_> *extraout_RDX_03;
  basic_string_view<char,_std::char_traits<char>_> *extraout_RDX_04;
  basic_string_view<char,_std::char_traits<char>_> *in_string_00;
  basic_string_view<char,_std::char_traits<char>_> *extraout_RDX_05;
  basic_string_view<char,_std::char_traits<char>_> *extraout_RDX_06;
  basic_string_view<char,_std::char_traits<char>_> *extraout_RDX_07;
  basic_string_view<char,_std::char_traits<char>_> *extraout_RDX_08;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *pcVar4;
  pointer *__ptr;
  decode_result dVar5;
  basic_string_view<char,_std::char_traits<char>_> in_string_01;
  basic_string_view<char,_std::char_traits<char>_> in_string_02;
  basic_string_view<char,_std::char_traits<char>_> lhs_00;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> rhs;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> rhs_00;
  basic_string_view<char,_std::char_traits<char>_> abcd_string_view;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> abcd_str;
  AssertHelper aAStack_88 [8];
  long *local_80;
  byte local_78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_68;
  jessilib *local_48;
  char *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string_view<char,_std::char_traits<char>_> *extraout_RDX;
  char *extraout_RDX_09;
  
  jessilib::string_cast<char,char32_t[5]>(&local_38,(jessilib *)L"ABCD",in_RDX);
  local_48 = (jessilib *)local_38._M_string_length;
  local_40 = local_38._M_dataplus._M_p;
  jessilib::string_cast<char16_t,std::__cxx11::string>(&local_68,(jessilib *)&local_38,in_string);
  lhs_00._M_str = local_38._M_dataplus._M_p;
  lhs_00._M_len = local_38._M_string_length;
  rhs._M_str = local_68._M_dataplus._M_p;
  rhs._M_len = local_68._M_string_length;
  local_78[0] = jessilib::equals<char,char16_t>(lhs_00,rhs);
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  paVar1 = &local_68.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_68._M_dataplus._M_p == paVar1) {
    in_string_00 = extraout_RDX;
    if (!(bool)local_78[0]) goto LAB_00207d2a;
  }
  else {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity * 2 + 2);
    in_string_00 = extraout_RDX_00;
    if ((local_78[0] & 1) == 0) {
LAB_00207d2a:
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)&local_68,(char *)local_78,
                 "equals(abcd_str, string_cast<typename TypeParam::second_type>(abcd_str))","false")
      ;
      testing::internal::AssertHelper::AssertHelper
                (aAStack_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
                 ,0x9d,(char *)local_68._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(aAStack_88,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(aAStack_88);
      in_string_00 = extraout_RDX_01;
      if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        in_string_00 = extraout_RDX_02;
      }
      if (local_80 != (long *)0x0) {
        (**(code **)(*local_80 + 8))();
        in_string_00 = extraout_RDX_03;
      }
    }
  }
  _Var2._M_p = local_38._M_dataplus._M_p;
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
    in_string_00 = extraout_RDX_04;
    _Var2._M_p = local_38._M_dataplus._M_p;
  }
  for (; (jessilib *)local_38._M_string_length != (jessilib *)0x0;
      local_38._M_string_length = (size_type)(local_38._M_string_length + -(long)in_string_00)) {
    in_string_01._M_str = (char *)in_string_00;
    in_string_01._M_len = (size_t)_Var2._M_p;
    dVar5 = jessilib::decode_codepoint_utf8<char>
                      ((jessilib *)local_38._M_string_length,in_string_01);
    in_string_00 = (basic_string_view<char,_std::char_traits<char>_> *)dVar5.units;
    if (in_string_00 == (basic_string_view<char,_std::char_traits<char>_> *)0x0) {
      local_78[0] = 0;
      local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)&local_68,(char *)local_78,"is_valid(abcd_str)","false");
      testing::internal::AssertHelper::AssertHelper
                (aAStack_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
                 ,0x9e,(char *)local_68._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(aAStack_88,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(aAStack_88);
      in_string_00 = extraout_RDX_05;
      if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        in_string_00 = extraout_RDX_06;
      }
      if (local_80 != (long *)0x0) {
        (**(code **)(*local_80 + 8))();
        in_string_00 = extraout_RDX_07;
      }
      if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_70,local_70);
        in_string_00 = extraout_RDX_08;
      }
      break;
    }
    _Var2._M_p = _Var2._M_p + (long)in_string_00;
  }
  lhs._M_str = local_40;
  lhs._M_len = (size_t)local_48;
  jessilib::string_cast<char16_t,std::basic_string_view<char,std::char_traits<char>>>
            (&local_68,(jessilib *)&local_48,in_string_00);
  rhs_00._M_str = local_68._M_dataplus._M_p;
  rhs_00._M_len = local_68._M_string_length;
  local_78[0] = jessilib::equals<char,char16_t>(lhs,rhs_00);
  local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_68._M_dataplus._M_p == paVar1) {
    pcVar4 = extraout_RDX_09;
    if ((bool)local_78[0]) goto LAB_00207f92;
  }
  else {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity * 2 + 2);
    pcVar4 = extraout_RDX_10;
    if ((local_78[0] & 1) != 0) goto LAB_00207f92;
  }
  testing::Message::Message((Message *)&local_80);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            ((AssertionResult *)&local_68,(char *)local_78,
             "equals(abcd_string_view, string_cast<typename TypeParam::second_type>(abcd_string_view))"
             ,"false");
  testing::internal::AssertHelper::AssertHelper
            (aAStack_88,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
             ,0xa1,(char *)local_68._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(aAStack_88,(Message *)&local_80);
  testing::internal::AssertHelper::~AssertHelper(aAStack_88);
  pcVar4 = extraout_RDX_11;
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    pcVar4 = extraout_RDX_12;
  }
  if (local_80 != (long *)0x0) {
    (**(code **)(*local_80 + 8))();
    pcVar4 = extraout_RDX_13;
  }
LAB_00207f92:
  this_00 = local_48;
  pcVar3 = local_40;
  if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_70,local_70);
    pcVar4 = extraout_RDX_14;
    this_00 = local_48;
    pcVar3 = local_40;
  }
  do {
    if (this_00 == (jessilib *)0x0) {
LAB_00208081:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    in_string_02._M_str = pcVar4;
    in_string_02._M_len = (size_t)pcVar3;
    dVar5 = jessilib::decode_codepoint_utf8<char>(this_00,in_string_02);
    pcVar4 = (char *)dVar5.units;
    if (pcVar4 == (char *)0x0) {
      local_78[0] = 0;
      local_70 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      testing::Message::Message((Message *)&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)&local_68,(char *)local_78,"is_valid(abcd_string_view)","false")
      ;
      testing::internal::AssertHelper::AssertHelper
                (aAStack_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
                 ,0xa2,(char *)local_68._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(aAStack_88,(Message *)&local_80);
      testing::internal::AssertHelper::~AssertHelper(aAStack_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
           *)local_68._M_dataplus._M_p != paVar1) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if (local_80 != (long *)0x0) {
        (**(code **)(*local_80 + 8))();
      }
      if (local_70 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_70,local_70);
      }
      goto LAB_00208081;
    }
    this_00 = this_00 + -(long)pcVar4;
    pcVar3 = pcVar3 + (long)pcVar4;
  } while( true );
}

Assistant:

TYPED_TEST(UnicodeFullTest, string_cast) {
	auto abcd_str = jessilib::string_cast<typename TypeParam::first_type>(U"ABCD");
	std::basic_string_view<typename TypeParam::first_type> abcd_string_view = abcd_str;

	EXPECT_TRUE(equals(abcd_str,
		string_cast<typename TypeParam::second_type>(abcd_str)));
	EXPECT_TRUE(is_valid(abcd_str));

	EXPECT_TRUE(equals(abcd_string_view,
		string_cast<typename TypeParam::second_type>(abcd_string_view)));
	EXPECT_TRUE(is_valid(abcd_string_view));
}